

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

bool __thiscall
ReplayInterface::enqueue_create_pipeline_layout
          (ReplayInterface *this,Hash hash,VkPipelineLayoutCreateInfo *create_info,
          VkPipelineLayout *layout)

{
  bool bVar1;
  VkPipelineLayout_T *pVVar2;
  VkPipelineLayoutCreateInfo *local_38;
  Hash recorded_hash;
  VkPipelineLayout *layout_local;
  VkPipelineLayoutCreateInfo *create_info_local;
  Hash hash_local;
  ReplayInterface *this_local;
  
  recorded_hash = (Hash)layout;
  layout_local = (VkPipelineLayout *)create_info;
  create_info_local = (VkPipelineLayoutCreateInfo *)hash;
  hash_local = (Hash)this;
  bVar1 = Fossilize::Hashing::compute_hash_pipeline_layout
                    (&this->recorder,create_info,(Hash *)&local_38);
  if (bVar1) {
    if (local_38 == create_info_local) {
      pVVar2 = fake_handle<VkPipelineLayout_T*>((uint64_t)create_info_local);
      *(VkPipelineLayout_T **)recorded_hash = pVVar2;
      this_local._7_1_ =
           Fossilize::StateRecorder::record_pipeline_layout
                     (&this->recorder,*(VkPipelineLayout *)recorded_hash,
                      (VkPipelineLayoutCreateInfo *)layout_local,0);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_pipeline_layout(Hash hash, const VkPipelineLayoutCreateInfo *create_info, VkPipelineLayout *layout) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_pipeline_layout(recorder, *create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*layout = fake_handle<VkPipelineLayout>(hash);
		return recorder.record_pipeline_layout(*layout, *create_info);
	}